

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::TanH_x86_avx512::forward_inplace(TanH_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 (*pauVar20) [64];
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar27 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 extraout_var [60];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar32 [32];
  
  iVar19 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  auVar33 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar34 = vxorps_avx512dq(auVar33,(undefined1  [64])_ps512_cephes_exp_C1);
  auVar35 = vxorps_avx512dq(auVar33,(undefined1  [64])_ps512_cephes_exp_C2);
  uVar23 = 0;
  uVar22 = (ulong)(uint)bottom_top_blob->c;
  auVar33 = auVar35;
  if (bottom_top_blob->c < 1) {
    uVar22 = uVar23;
  }
  for (; uVar23 != uVar22; uVar23 = uVar23 + 1) {
    pauVar20 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar23 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    for (iVar21 = 0; iVar21 + 0xf < iVar19; iVar21 = iVar21 + 0x10) {
      auVar36 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      auVar33 = vmulps_avx512f(auVar36,*pauVar20);
      auVar33 = vminps_avx512f(auVar33,(undefined1  [64])_ps512_exp_hi);
      auVar33 = vmaxps_avx512f(auVar33,(undefined1  [64])_ps512_exp_lo);
      auVar37 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_LOG2EF,auVar33,
                                    (undefined1  [64])_ps512_cephes_exp_p5);
      auVar38 = vrndscaleps_avx512f(auVar37,1);
      uVar2 = vcmpps_avx512f(auVar37,auVar38,1);
      auVar37 = vsubps_avx512f(auVar38,(undefined1  [64])_ps512_1);
      bVar1 = (bool)((byte)uVar2 & 1);
      auVar39._0_4_ = (uint)bVar1 * auVar37._0_4_ | (uint)!bVar1 * auVar38._0_4_;
      bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar1 * auVar37._4_4_ | (uint)!bVar1 * auVar38._4_4_;
      bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar1 * auVar37._8_4_ | (uint)!bVar1 * auVar38._8_4_;
      bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar1 * auVar37._12_4_ | (uint)!bVar1 * auVar38._12_4_;
      bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
      auVar39._16_4_ = (uint)bVar1 * auVar37._16_4_ | (uint)!bVar1 * auVar38._16_4_;
      bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
      auVar39._20_4_ = (uint)bVar1 * auVar37._20_4_ | (uint)!bVar1 * auVar38._20_4_;
      bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
      auVar39._24_4_ = (uint)bVar1 * auVar37._24_4_ | (uint)!bVar1 * auVar38._24_4_;
      bVar1 = (bool)((byte)(uVar2 >> 7) & 1);
      auVar39._28_4_ = (uint)bVar1 * auVar37._28_4_ | (uint)!bVar1 * auVar38._28_4_;
      bVar1 = (bool)((byte)(uVar2 >> 8) & 1);
      auVar39._32_4_ = (uint)bVar1 * auVar37._32_4_ | (uint)!bVar1 * auVar38._32_4_;
      bVar1 = (bool)((byte)(uVar2 >> 9) & 1);
      auVar39._36_4_ = (uint)bVar1 * auVar37._36_4_ | (uint)!bVar1 * auVar38._36_4_;
      bVar1 = (bool)((byte)(uVar2 >> 10) & 1);
      auVar39._40_4_ = (uint)bVar1 * auVar37._40_4_ | (uint)!bVar1 * auVar38._40_4_;
      bVar1 = (bool)((byte)(uVar2 >> 0xb) & 1);
      auVar39._44_4_ = (uint)bVar1 * auVar37._44_4_ | (uint)!bVar1 * auVar38._44_4_;
      bVar1 = (bool)((byte)(uVar2 >> 0xc) & 1);
      auVar39._48_4_ = (uint)bVar1 * auVar37._48_4_ | (uint)!bVar1 * auVar38._48_4_;
      bVar1 = (bool)((byte)(uVar2 >> 0xd) & 1);
      auVar39._52_4_ = (uint)bVar1 * auVar37._52_4_ | (uint)!bVar1 * auVar38._52_4_;
      bVar1 = (bool)((byte)(uVar2 >> 0xe) & 1);
      auVar39._56_4_ = (uint)bVar1 * auVar37._56_4_ | (uint)!bVar1 * auVar38._56_4_;
      bVar1 = SUB81(uVar2 >> 0xf,0);
      auVar39._60_4_ = (uint)bVar1 * auVar37._60_4_ | (uint)!bVar1 * auVar38._60_4_;
      auVar33 = vfmadd231ps_avx512f(auVar33,auVar39,auVar34);
      auVar33 = vfmadd231ps_avx512f(auVar33,auVar39,auVar35);
      auVar37 = vmulps_avx512f(auVar33,auVar33);
      auVar38 = vfmadd132ps_avx512f(auVar33,(undefined1  [64])_ps512_cephes_exp_p1,
                                    (undefined1  [64])_ps512_cephes_exp_p0);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar33,(undefined1  [64])_ps512_cephes_exp_p2);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar33,(undefined1  [64])_ps512_cephes_exp_p3);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar33,(undefined1  [64])_ps512_cephes_exp_p4);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar33,(undefined1  [64])_ps512_cephes_exp_p5);
      auVar33 = vfmadd213ps_avx512f(auVar38,auVar37,auVar33);
      auVar33 = vaddps_avx512f(auVar33,(undefined1  [64])_ps512_1);
      auVar37 = vcvttps2dq_avx512f(auVar39);
      auVar37 = vpaddd_avx512f(auVar37,(undefined1  [64])_pi32_512_0x7f);
      auVar37 = vpslld_avx512f(auVar37,0x17);
      auVar38 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar37 = vfmadd213ps_avx512f(auVar37,auVar33,auVar38);
      auVar33 = vrcp14ps_avx512f(auVar37);
      auVar37 = vfmsub213ps_avx512f(auVar37,auVar33,auVar38);
      auVar37 = vfnmadd132ps_avx512vl(auVar37,auVar33,auVar33);
      auVar36 = vfnmsub213ps_avx512f(auVar37,auVar36,auVar38);
      *pauVar20 = auVar36;
      pauVar20 = pauVar20 + 1;
    }
    for (; iVar21 + 7 < iVar19; iVar21 = iVar21 + 8) {
      auVar51._8_4_ = 0xc0000000;
      auVar51._0_8_ = 0xc0000000c0000000;
      auVar51._12_4_ = 0xc0000000;
      auVar51._16_4_ = 0xc0000000;
      auVar51._20_4_ = 0xc0000000;
      auVar51._24_4_ = 0xc0000000;
      auVar51._28_4_ = 0xc0000000;
      auVar36._0_4_ = *(float *)*pauVar20 * -2.0;
      auVar36._4_4_ = *(float *)(*pauVar20 + 4) * -2.0;
      auVar36._8_4_ = *(float *)(*pauVar20 + 8) * -2.0;
      auVar36._12_4_ = *(float *)(*pauVar20 + 0xc) * -2.0;
      auVar36._16_4_ = *(float *)(*pauVar20 + 0x10) * -2.0;
      auVar36._20_4_ = *(float *)(*pauVar20 + 0x14) * -2.0;
      auVar36._28_36_ = auVar33._28_36_;
      auVar36._24_4_ = *(float *)(*pauVar20 + 0x18) * -2.0;
      auVar28._8_4_ = 0x42b0c0a5;
      auVar28._0_8_ = 0x42b0c0a542b0c0a5;
      auVar28._12_4_ = 0x42b0c0a5;
      auVar28._16_4_ = 0x42b0c0a5;
      auVar28._20_4_ = 0x42b0c0a5;
      auVar28._24_4_ = 0x42b0c0a5;
      auVar28._28_4_ = 0x42b0c0a5;
      auVar28 = vminps_avx512vl(auVar36._0_32_,auVar28);
      auVar29._8_4_ = 0xc2b0c0a5;
      auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar29._12_4_ = 0xc2b0c0a5;
      auVar29._16_4_ = 0xc2b0c0a5;
      auVar29._20_4_ = 0xc2b0c0a5;
      auVar29._24_4_ = 0xc2b0c0a5;
      auVar29._28_4_ = 0xc2b0c0a5;
      auVar29 = vmaxps_avx512vl(auVar28,auVar29);
      auVar53._8_4_ = 0x3f000000;
      auVar53._0_8_ = 0x3f0000003f000000;
      auVar53._12_4_ = 0x3f000000;
      auVar53._16_4_ = 0x3f000000;
      auVar53._20_4_ = 0x3f000000;
      auVar53._24_4_ = 0x3f000000;
      auVar53._28_4_ = 0x3f000000;
      auVar30._8_4_ = 0x3fb8aa3b;
      auVar30._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar30._12_4_ = 0x3fb8aa3b;
      auVar30._16_4_ = 0x3fb8aa3b;
      auVar30._20_4_ = 0x3fb8aa3b;
      auVar30._24_4_ = 0x3fb8aa3b;
      auVar30._28_4_ = 0x3fb8aa3b;
      auVar30 = vfmadd231ps_avx512vl(auVar53,auVar29,auVar30);
      auVar28 = vroundps_avx(auVar30,1);
      uVar2 = vcmpps_avx512vl(auVar30,auVar28,1);
      auVar54._8_4_ = 0x3f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      auVar54._12_4_ = 0x3f800000;
      auVar54._16_4_ = 0x3f800000;
      auVar54._20_4_ = 0x3f800000;
      auVar54._24_4_ = 0x3f800000;
      auVar54._28_4_ = 0x3f800000;
      auVar31 = vsubps_avx512vl(auVar28,auVar54);
      bVar1 = (bool)((byte)uVar2 & 1);
      auVar32._0_4_ = (float)((uint)bVar1 * auVar31._0_4_ | (uint)!bVar1 * auVar28._0_4_);
      bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar32._4_4_ = (float)((uint)bVar1 * auVar31._4_4_ | (uint)!bVar1 * auVar28._4_4_);
      bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar32._8_4_ = (float)((uint)bVar1 * auVar31._8_4_ | (uint)!bVar1 * auVar28._8_4_);
      bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar32._12_4_ = (float)((uint)bVar1 * auVar31._12_4_ | (uint)!bVar1 * auVar28._12_4_);
      bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
      auVar32._16_4_ = (float)((uint)bVar1 * auVar31._16_4_ | (uint)!bVar1 * auVar28._16_4_);
      bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
      auVar32._20_4_ = (float)((uint)bVar1 * auVar31._20_4_ | (uint)!bVar1 * auVar28._20_4_);
      bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
      auVar32._24_4_ = (float)((uint)bVar1 * auVar31._24_4_ | (uint)!bVar1 * auVar28._24_4_);
      bVar1 = SUB81(uVar2 >> 7,0);
      auVar32._28_4_ = (float)((uint)bVar1 * auVar31._28_4_ | (uint)!bVar1 * auVar28._28_4_);
      auVar31._8_4_ = 0x3f318000;
      auVar31._0_8_ = 0x3f3180003f318000;
      auVar31._12_4_ = 0x3f318000;
      auVar31._16_4_ = 0x3f318000;
      auVar31._20_4_ = 0x3f318000;
      auVar31._24_4_ = 0x3f318000;
      auVar31._28_4_ = 0x3f318000;
      auVar28 = vfmsub231ps_avx512vl(auVar29,auVar32,auVar31);
      auVar12._8_4_ = 0x395e8083;
      auVar12._0_8_ = 0x395e8083395e8083;
      auVar12._12_4_ = 0x395e8083;
      auVar12._16_4_ = 0x395e8083;
      auVar12._20_4_ = 0x395e8083;
      auVar12._24_4_ = 0x395e8083;
      auVar12._28_4_ = 0x395e8083;
      auVar28 = vfmsub231ps_avx512vl(auVar28,auVar32,auVar12);
      auVar18._4_4_ = auVar28._4_4_ * auVar28._4_4_;
      auVar18._0_4_ = auVar28._0_4_ * auVar28._0_4_;
      auVar18._8_4_ = auVar28._8_4_ * auVar28._8_4_;
      auVar18._12_4_ = auVar28._12_4_ * auVar28._12_4_;
      auVar18._16_4_ = auVar28._16_4_ * auVar28._16_4_;
      auVar18._20_4_ = auVar28._20_4_ * auVar28._20_4_;
      auVar18._24_4_ = auVar28._24_4_ * auVar28._24_4_;
      auVar18._28_4_ = auVar30._28_4_;
      auVar49._8_4_ = 0x39506967;
      auVar49._0_8_ = 0x3950696739506967;
      auVar49._12_4_ = 0x39506967;
      auVar49._16_4_ = 0x39506967;
      auVar49._20_4_ = 0x39506967;
      auVar49._24_4_ = 0x39506967;
      auVar49._28_4_ = 0x39506967;
      auVar13._8_4_ = 0x3ab743ce;
      auVar13._0_8_ = 0x3ab743ce3ab743ce;
      auVar13._12_4_ = 0x3ab743ce;
      auVar13._16_4_ = 0x3ab743ce;
      auVar13._20_4_ = 0x3ab743ce;
      auVar13._24_4_ = 0x3ab743ce;
      auVar13._28_4_ = 0x3ab743ce;
      auVar29 = vfmadd213ps_avx512vl(auVar49,auVar28,auVar13);
      auVar14._8_4_ = 0x3c088908;
      auVar14._0_8_ = 0x3c0889083c088908;
      auVar14._12_4_ = 0x3c088908;
      auVar14._16_4_ = 0x3c088908;
      auVar14._20_4_ = 0x3c088908;
      auVar14._24_4_ = 0x3c088908;
      auVar14._28_4_ = 0x3c088908;
      auVar29 = vfmadd213ps_avx512vl(auVar29,auVar28,auVar14);
      auVar15._8_4_ = 0x3d2aa9c1;
      auVar15._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar15._12_4_ = 0x3d2aa9c1;
      auVar15._16_4_ = 0x3d2aa9c1;
      auVar15._20_4_ = 0x3d2aa9c1;
      auVar15._24_4_ = 0x3d2aa9c1;
      auVar15._28_4_ = 0x3d2aa9c1;
      auVar29 = vfmadd213ps_avx512vl(auVar29,auVar28,auVar15);
      auVar16._8_4_ = 0x3e2aaaaa;
      auVar16._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar16._12_4_ = 0x3e2aaaaa;
      auVar16._16_4_ = 0x3e2aaaaa;
      auVar16._20_4_ = 0x3e2aaaaa;
      auVar16._24_4_ = 0x3e2aaaaa;
      auVar16._28_4_ = 0x3e2aaaaa;
      auVar29 = vfmadd213ps_avx512vl(auVar29,auVar28,auVar16);
      auVar24 = vfmadd213ps_fma(auVar29,auVar28,auVar53);
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar18,auVar28);
      auVar42._0_4_ = auVar24._0_4_ + 1.0;
      auVar42._4_4_ = auVar24._4_4_ + 1.0;
      auVar42._8_4_ = auVar24._8_4_ + 1.0;
      auVar42._12_4_ = auVar24._12_4_ + 1.0;
      auVar42._16_4_ = 0x3f800000;
      auVar42._20_4_ = 0x3f800000;
      auVar42._24_4_ = 0x3f800000;
      auVar42._28_4_ = 0x3f800000;
      auVar45._0_4_ = (int)auVar32._0_4_;
      auVar45._4_4_ = (int)auVar32._4_4_;
      auVar45._8_4_ = (int)auVar32._8_4_;
      auVar45._12_4_ = (int)auVar32._12_4_;
      auVar45._16_4_ = (int)auVar32._16_4_;
      auVar45._20_4_ = (int)auVar32._20_4_;
      auVar45._24_4_ = (int)auVar32._24_4_;
      auVar45._28_4_ = (int)auVar32._28_4_;
      auVar28 = vpslld_avx2(auVar45,0x17);
      auVar17._8_4_ = 0x3f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17._12_4_ = 0x3f800000;
      auVar17._16_4_ = 0x3f800000;
      auVar17._20_4_ = 0x3f800000;
      auVar17._24_4_ = 0x3f800000;
      auVar17._28_4_ = 0x3f800000;
      auVar28 = vpaddd_avx512vl(auVar28,auVar17);
      auVar24 = vfmadd213ps_fma(auVar28,auVar42,auVar54);
      auVar28 = vrcpps_avx(ZEXT1632(auVar24));
      auVar33 = ZEXT3264(auVar28);
      auVar24 = vfmsub213ps_fma(ZEXT1632(auVar24),auVar28,auVar54);
      auVar24 = vfnmadd132ps_fma(ZEXT1632(auVar24),auVar28,auVar28);
      auVar24 = vfnmsub213ps_fma(ZEXT1632(auVar24),auVar51,auVar54);
      *(undefined1 (*) [32])*pauVar20 = ZEXT1632(auVar24);
      pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x20);
    }
    for (; iVar21 + 3 < iVar19; iVar21 = iVar21 + 4) {
      auVar40._0_4_ = *(float *)*pauVar20 * -2.0;
      auVar40._4_4_ = *(float *)(*pauVar20 + 4) * -2.0;
      auVar40._8_4_ = *(float *)(*pauVar20 + 8) * -2.0;
      auVar40._12_4_ = *(float *)(*pauVar20 + 0xc) * -2.0;
      auVar24._8_4_ = 0x42b0c0a5;
      auVar24._0_8_ = 0x42b0c0a542b0c0a5;
      auVar24._12_4_ = 0x42b0c0a5;
      auVar24 = vminps_avx512vl(auVar40,auVar24);
      auVar25._8_4_ = 0xc2b0c0a5;
      auVar25._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar25._12_4_ = 0xc2b0c0a5;
      auVar25 = vmaxps_avx512vl(auVar24,auVar25);
      auVar50._8_4_ = 0x3f000000;
      auVar50._0_8_ = 0x3f0000003f000000;
      auVar50._12_4_ = 0x3f000000;
      auVar26._8_4_ = 0x3fb8aa3b;
      auVar26._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar26._12_4_ = 0x3fb8aa3b;
      auVar26 = vfmadd231ps_avx512vl(auVar50,auVar25,auVar26);
      auVar46._0_4_ = (int)auVar26._0_4_;
      auVar46._4_4_ = (int)auVar26._4_4_;
      auVar46._8_4_ = (int)auVar26._8_4_;
      auVar46._12_4_ = (int)auVar26._12_4_;
      auVar24 = vcvtdq2ps_avx(auVar46);
      uVar2 = vcmpps_avx512vl(auVar26,auVar24,1);
      auVar52._8_4_ = 0x3f800000;
      auVar52._0_8_ = 0x3f8000003f800000;
      auVar52._12_4_ = 0x3f800000;
      auVar26 = vsubps_avx512vl(auVar24,auVar52);
      bVar1 = (bool)((byte)uVar2 & 1);
      auVar27._0_4_ = (float)((uint)bVar1 * auVar26._0_4_ | (uint)!bVar1 * auVar24._0_4_);
      bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar27._4_4_ = (float)((uint)bVar1 * auVar26._4_4_ | (uint)!bVar1 * auVar24._4_4_);
      bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar27._8_4_ = (float)((uint)bVar1 * auVar26._8_4_ | (uint)!bVar1 * auVar24._8_4_);
      bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar27._12_4_ = (float)((uint)bVar1 * auVar26._12_4_ | (uint)!bVar1 * auVar24._12_4_);
      auVar3._8_4_ = 0x3f318000;
      auVar3._0_8_ = 0x3f3180003f318000;
      auVar3._12_4_ = 0x3f318000;
      auVar24 = vfmsub231ps_avx512vl(auVar25,auVar27,auVar3);
      auVar4._8_4_ = 0x395e8083;
      auVar4._0_8_ = 0x395e8083395e8083;
      auVar4._12_4_ = 0x395e8083;
      auVar25 = vfmsub231ps_avx512vl(auVar24,auVar27,auVar4);
      auVar43._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar43._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar43._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar43._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar48._8_4_ = 0x39506967;
      auVar48._0_8_ = 0x3950696739506967;
      auVar48._12_4_ = 0x39506967;
      auVar5._8_4_ = 0x3ab743ce;
      auVar5._0_8_ = 0x3ab743ce3ab743ce;
      auVar5._12_4_ = 0x3ab743ce;
      auVar24 = vfmadd213ps_avx512vl(auVar48,auVar25,auVar5);
      auVar6._8_4_ = 0x3c088908;
      auVar6._0_8_ = 0x3c0889083c088908;
      auVar6._12_4_ = 0x3c088908;
      auVar24 = vfmadd213ps_avx512vl(auVar24,auVar25,auVar6);
      auVar7._8_4_ = 0x3d2aa9c1;
      auVar7._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar7._12_4_ = 0x3d2aa9c1;
      auVar24 = vfmadd213ps_avx512vl(auVar24,auVar25,auVar7);
      auVar8._8_4_ = 0x3e2aaaaa;
      auVar8._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar8._12_4_ = 0x3e2aaaaa;
      auVar24 = vfmadd213ps_avx512vl(auVar24,auVar25,auVar8);
      auVar24 = vfmadd213ps_fma(auVar24,auVar25,auVar50);
      auVar24 = vfmadd213ps_fma(auVar24,auVar43,auVar25);
      auVar41._0_4_ = auVar24._0_4_ + 1.0;
      auVar41._4_4_ = auVar24._4_4_ + 1.0;
      auVar41._8_4_ = auVar24._8_4_ + 1.0;
      auVar41._12_4_ = auVar24._12_4_ + 1.0;
      auVar44._0_4_ = (int)auVar27._0_4_;
      auVar44._4_4_ = (int)auVar27._4_4_;
      auVar44._8_4_ = (int)auVar27._8_4_;
      auVar44._12_4_ = (int)auVar27._12_4_;
      auVar24 = vpslld_avx(auVar44,0x17);
      auVar9._8_4_ = 0x3f800000;
      auVar9._0_8_ = 0x3f8000003f800000;
      auVar9._12_4_ = 0x3f800000;
      auVar24 = vpaddd_avx512vl(auVar24,auVar9);
      auVar25 = vfmadd213ps_fma(auVar24,auVar41,auVar52);
      auVar24 = vrcpps_avx(auVar25);
      auVar47._0_4_ = auVar24._0_4_ + auVar24._0_4_;
      auVar47._4_4_ = auVar24._4_4_ + auVar24._4_4_;
      auVar47._8_4_ = auVar24._8_4_ + auVar24._8_4_;
      auVar47._12_4_ = auVar24._12_4_ + auVar24._12_4_;
      auVar10._8_4_ = 0x40000000;
      auVar10._0_8_ = 0x4000000040000000;
      auVar10._12_4_ = 0x40000000;
      auVar25 = vfmsub213ps_avx512vl(auVar25,auVar47,auVar10);
      auVar24 = vfnmadd213ps_fma(auVar25,auVar24,auVar47);
      auVar11._8_4_ = 0xbf800000;
      auVar11._0_8_ = 0xbf800000bf800000;
      auVar11._12_4_ = 0xbf800000;
      auVar24 = vaddps_avx512vl(auVar24,auVar11);
      auVar33 = ZEXT1664(auVar24);
      *(undefined1 (*) [16])*pauVar20 = auVar24;
      pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x10);
    }
    for (; iVar21 < iVar19; iVar21 = iVar21 + 1) {
      auVar33._0_4_ = tanhf(*(float *)*pauVar20);
      auVar33._4_60_ = extraout_var;
      *(float *)*pauVar20 = auVar33._0_4_;
      pauVar20 = (undefined1 (*) [64])(*pauVar20 + 4);
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}